

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O3

int anon_unknown.dwarf_43935::xFullPathname(sqlite3_vfs *param_1,char *zName,int nOut,char *zOut)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = 1;
  if (zName != (char *)0x0) {
    cVar3 = *zName;
    bVar5 = 0 < nOut;
    if (nOut < 1 || cVar3 == '\0') {
      uVar2 = 0;
    }
    else {
      uVar4 = 0;
      do {
        zOut[uVar4] = cVar3;
        uVar2 = uVar4 + 1;
        bVar5 = uVar2 < (uint)nOut;
        if (!bVar5) break;
        cVar3 = zName[uVar4 + 1];
        uVar4 = uVar2;
      } while (cVar3 != '\0');
    }
    if (bVar5) {
      zOut[uVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int xFullPathname(sqlite3_vfs *, const char *zName, int nOut, char *zOut)
{
    if (!zName)
        return SQLITE_ERROR;

    int i = 0;
    for (;zName[i] && i < nOut; ++i)
        zOut[i] = zName[i];

    if (i >= nOut)
        return SQLITE_ERROR;

    zOut[i] = '\0';
    return SQLITE_OK;
}